

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string *psVar1;
  PassOptions **ppPVar2;
  size_type *psVar3;
  size_type *psVar4;
  undefined8 uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  string *psVar9;
  ostream *poVar10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  undefined8 extraout_RAX;
  size_type *psVar16;
  long *plVar17;
  _Alloc_hider _Var18;
  int iVar19;
  int iVar20;
  undefined1 local_1170 [8];
  ToolOptions options;
  ofstream dst;
  long local_fe0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_fd8 [14];
  ios_base local_ef8 [760];
  undefined1 local_c00 [8];
  ProgramResult result;
  size_type **local_a78;
  undefined8 uStack_a70;
  code *local_a68;
  code *pcStack_a60;
  string *local_a58;
  undefined8 uStack_a50;
  code *local_a48;
  code *pcStack_a40;
  bool *local_a38;
  undefined8 uStack_a30;
  code *local_a28;
  code *pcStack_a20;
  bool *local_a18;
  undefined8 uStack_a10;
  code *local_a08;
  code *pcStack_a00;
  bool *local_9f8;
  undefined8 uStack_9f0;
  code *local_9e8;
  code *pcStack_9e0;
  bool *local_9d8;
  undefined8 uStack_9d0;
  code *local_9c8;
  code *pcStack_9c0;
  bool *local_9b8;
  undefined8 uStack_9b0;
  code *local_9a8;
  code *pcStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  code *local_988;
  code *local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  code *local_968;
  code *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  code *local_948;
  code *local_940;
  size_type **local_938;
  undefined8 uStack_930;
  code *local_928;
  code *pcStack_920;
  long *local_910 [2];
  long local_900 [2];
  long *local_8f0 [2];
  long local_8e0 [2];
  long *local_8d0 [2];
  long local_8c0 [2];
  long *local_8b0 [2];
  long local_8a0 [2];
  long *local_890 [2];
  long local_880 [2];
  string local_870;
  string local_850;
  string local_830;
  long *local_810 [2];
  long local_800 [2];
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  long *local_750 [2];
  long local_740 [2];
  long *local_730 [2];
  long local_720 [2];
  long *local_710 [2];
  long local_700 [2];
  long *local_6f0 [2];
  long local_6e0 [2];
  long *local_6d0 [2];
  long local_6c0 [2];
  long *local_6b0 [2];
  long local_6a0 [2];
  char *local_690;
  string binDir;
  ModuleWriter writer;
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  string local_298;
  string local_278;
  string local_258;
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  code **local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  code *pcStack_1c0;
  undefined1 auStack_1b8 [8];
  ProgramResult resultOnInvalid;
  anon_class_8_1_a7eb7a0b local_180;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  long local_170 [2];
  size_type *local_160;
  string input;
  ProgramResult resultOnValid;
  string command;
  string WasmReduceOption;
  string test;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  size_type *local_90;
  string working;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  char **local_40;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31 [4];
  bool deNan;
  bool verbose;
  bool debugInfo;
  bool force;
  bool binary;
  
  local_160 = &input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  WasmReduceOption.field_2._8_8_ = &test._M_string_length;
  test._M_dataplus._M_p = (pointer)0x0;
  test._M_string_length._0_1_ = 0;
  local_90 = &working._M_string_length;
  working._M_dataplus._M_p = (pointer)0x0;
  working._M_string_length._0_1_ = 0;
  resultOnValid.time = (double)&command._M_string_length;
  command._M_dataplus._M_p = (pointer)0x0;
  command._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,*argv,(allocator<char> *)local_c00);
  wasm::Path::getDirName((string *)&local_690);
  if ((long *)options._376_8_ != &local_fe0) {
    operator_delete((void *)options._376_8_,local_fe0 + 1);
  }
  local_31[0] = true;
  local_35 = false;
  local_34 = false;
  local_33 = false;
  local_32 = false;
  command.field_2._8_8_ = &WasmReduceOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&command.field_2 + 8),"wasm-reduce options","");
  options._376_8_ = &local_fe0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-reduce","");
  psVar1 = &result.output;
  local_c00 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,
             "Reduce a wasm file to a smaller one with the same behavior on a given command.\n\nTypical usage:\n\n  wasm-reduce orig.wasm \'--command=bash a.sh\' --test t.wasm --working w.wasm\n\nThe original file orig.wasm is where we begin. We then repeatedly test a small\nreduction of it by writing that modification to the \'test file\' (specified by\n\'--test\'), and we run the command, in this example \'bash a.sh\'. That command\nshould use the test file (and not the original file or any other one). Whenever\nthe reduction works, we write that new smaller file to the \'working file\'\n(specified by \'--working\'). The reduction \'works\' if it correctly preserves the\nbehavior of the command on the original input, specifically, that it has the\nsame stdout and the result return code. Each time reduction works we continue to\nreduce from that point (and each time it fails, we go back and try something\nelse).\n\nAs mentioned above, the command should run on the test file. That is, the first\nthing that wasm-reduce does on the example above is, effectively,\n\n  cp orig.wasm t.wasm\n  bash a.sh\n\nIn other words, it copies the original to the test file, and runs the command.\nWhatever the command does, we will preserve as we copy progressively smaller\nfiles to t.wasm. As we make progress, the smallest file will be written to\nthe working file, w.wasm, and when reduction is done you will find the final\nresult there.\n\nComparison to creduce:\n\n1. creduce requires the command to return 0. wasm-reduce is often used to reduce\n   crashes, which have non-zero return codes, so it is natural to allow any\n   return code. As mentioned above, we preserve the return code as we reduce.\n2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part\n   of the principle of preserving the original behavior of the command (if your\n   stdout varies in uninteresting ways, your command can be a script that runs\n   the real command and captures stdout to /dev/null, or filters it).\n3. creduce tramples the original input file as it reduces. wasm-reduce never\n   modifies th..." /* TRUNCATED STRING LITERAL */
             ,"");
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1170,(string *)&options.enabledFeatures,(string *)local_c00);
  if (local_c00 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_c00,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._376_8_ != &local_fe0) {
    operator_delete((void *)options._376_8_,local_fe0 + 1);
  }
  options._376_8_ = &local_fe0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--command","")
  ;
  local_c00 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c00,"-cmd","");
  local_48 = CONCAT44(local_48._4_4_,argc);
  binDir.field_2._8_8_ = &writer.options;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&binDir.field_2 + 8),
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,"");
  resultOnInvalid.code = 0;
  resultOnInvalid._4_4_ = 0;
  auStack_1b8 = (undefined1  [8])&resultOnValid.time;
  resultOnInvalid.output._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1317:10)>
       ::_M_invoke;
  resultOnInvalid.output._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1317:10)>
                ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add((string *)&options,(string *)&options.enabledFeatures,
                              (string *)local_c00,(string *)(binDir.field_2._M_local_buf + 8),
                              (int)&command + 0x18,(function *)0x1,SUB81(auStack_1b8,0));
  input.field_2._8_8_ = &resultOnValid.output;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&input.field_2 + 8),"--test","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"-t","");
  test.field_2._8_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&test.field_2 + 8),
             "Test file (this will be written to test, the given command should read it when we call it)"
             ,"");
  uStack_1d0 = 0;
  local_1d8 = (code **)((long)&WasmReduceOption.field_2 + 8);
  pcStack_1c0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1324:10)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1324:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)(input.field_2._M_local_buf + 8),(string *)&local_68,
                              (string *)(test.field_2._M_local_buf + 8),(int)&command + 0x18,
                              (function *)0x1,SUB81(&local_1d8,0));
  local_180.force = (bool *)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"--working","");
  writer.sourceMapUrl.field_2._8_8_ = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&writer.sourceMapUrl.field_2 + 8),"-w","");
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,"");
  uStack_a70 = 0;
  local_a78 = &local_90;
  pcStack_a60 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1332:10)>
                ::_M_invoke;
  local_a68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1332:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)&local_180,
                              (string *)(writer.sourceMapUrl.field_2._M_local_buf + 8),
                              (string *)local_5d8,(int)&command + 0x18,(function *)0x1,
                              SUB81(&local_a78,0));
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"--binaries","");
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"-b","");
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_578,"binaryen binaries location (bin/ directory)","");
  uStack_a50 = 0;
  pcStack_a40 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1338:10)>
                ::_M_invoke;
  local_a48 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1338:10)>
              ::_M_manager;
  local_a58 = (string *)&local_690;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_5b8,(string *)local_598,(string *)local_578,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_a58,0));
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"--text","");
  local_538[0] = local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"-S","");
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_518,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,"");
  uStack_a30 = 0;
  local_a38 = local_31;
  pcStack_a20 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1348:10)>
                ::_M_invoke;
  local_a28 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1348:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_558,(string *)local_538,(string *)local_518,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_a38,0));
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"--denan","");
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"");
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"Avoid nans when reducing","")
  ;
  uStack_a10 = 0;
  local_a18 = &local_35;
  pcStack_a00 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1354:10)>
                ::_M_invoke;
  local_a08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1354:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_4f8,(string *)local_4d8,(string *)local_4b8,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_a18,0));
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"--verbose","");
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"-v","");
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Verbose output mode","");
  uStack_9f0 = 0;
  local_9f8 = &local_34;
  pcStack_9e0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1360:10)>
                ::_M_invoke;
  local_9e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1360:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_498,(string *)local_478,(string *)local_458,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_9f8,0));
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"--debugInfo","");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"-g","");
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"Keep debug info in binaries","");
  uStack_9d0 = 0;
  local_9d8 = &local_33;
  pcStack_9c0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1366:10)>
                ::_M_invoke;
  local_9c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1366:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_438,(string *)local_418,(string *)local_3f8,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_9d8,0));
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"--force","");
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"-f","");
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_398,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             "");
  uStack_9b0 = 0;
  local_9b8 = &local_32;
  pcStack_9a0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1373:10)>
                ::_M_invoke;
  local_9a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1373:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_3d8,(string *)local_3b8,(string *)local_398,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_9b8,0));
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"--timeout","");
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"-to","");
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_338,
             "A timeout to apply to each execution of the command, in seconds (default: 2)","");
  local_998 = 0;
  uStack_990 = 0;
  local_980 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1380:10)>
              ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1380:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_378,(string *)local_358,(string *)local_338,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_998,0));
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"--extra-flags","");
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"-ef","");
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             "");
  local_978 = 0;
  uStack_970 = 0;
  local_960 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1390:10)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1390:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_318,(string *)local_2f8,(string *)local_2d8,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_978,0));
  local_910[0] = local_900;
  local_40 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"--save-all-working","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"-saw","");
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8f0,"Save all intermediate working files, as $WORKING.0, .1, .2 etc",""
            );
  local_958 = 0;
  uStack_950 = 0;
  local_940 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1399:10)>
              ::_M_invoke;
  local_948 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1399:10)>
              ::_M_manager;
  psVar9 = (string *)
           wasm::Options::add(psVar9,(string *)local_910,(string *)local_2b8,(string *)local_8f0,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_958,0));
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"INFILE","");
  uStack_930 = 0;
  local_938 = &local_160;
  pcStack_920 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1406:7)>
                ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1406:7)>
              ::_M_manager;
  wasm::Options::add_positional(psVar9,(Arguments)local_8d0,(function *)0x1);
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,3);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],local_8c0[0] + 1);
  }
  if (local_948 != (code *)0x0) {
    (*local_948)(&local_958,&local_958,3);
  }
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0],local_8e0[0] + 1);
  }
  ppPVar2 = &writer.options;
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if (local_910[0] != local_900) {
    operator_delete(local_910[0],local_900[0] + 1);
  }
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,3);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  if (local_988 != (code *)0x0) {
    (*local_988)(&local_998,&local_998,3);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (local_9a8 != (code *)0x0) {
    (*local_9a8)(&local_9b8,&local_9b8,3);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_9c8 != (code *)0x0) {
    (*local_9c8)(&local_9d8,&local_9d8,3);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  if (local_9e8 != (code *)0x0) {
    (*local_9e8)(&local_9f8,&local_9f8,3);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if (local_a08 != (code *)0x0) {
    (*local_a08)(&local_a18,&local_a18,3);
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0],local_4a8[0] + 1);
  }
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  if (local_a28 != (code *)0x0) {
    (*local_a28)(&local_a38,&local_a38,3);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  if (local_a48 != (code *)0x0) {
    (*local_a48)(&local_a58,&local_a58,3);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_a68 != (code *)0x0) {
    (*local_a68)(&local_a78,&local_a78,3);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((long *)writer.sourceMapUrl.field_2._8_8_ != local_5e8) {
    operator_delete((void *)writer.sourceMapUrl.field_2._8_8_,local_5e8[0] + 1);
  }
  if (local_180.force != (bool *)local_170) {
    operator_delete(local_180.force,local_170[0] + 1);
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_a0) {
    operator_delete((void *)test.field_2._8_8_,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if (resultOnInvalid.output._M_dataplus._M_p != (pointer)0x0) {
    (*(code *)resultOnInvalid.output._M_dataplus._M_p)(auStack_1b8,auStack_1b8,3);
  }
  if ((PassOptions **)binDir.field_2._8_8_ != ppPVar2) {
    operator_delete((void *)binDir.field_2._8_8_,(ulong)&(writer.options)->validate);
  }
  if (local_c00 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_c00,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._376_8_ != &local_fe0) {
    operator_delete((void *)options._376_8_,local_fe0 + 1);
  }
  wasm::Options::parse((int)&options,(char **)(local_48 & 0xffffffff));
  if (local_33 == true) {
    std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  }
  if (test._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"test file not provided\n");
LAB_001132ec:
    wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  if (working._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"working file not provided\n");
    goto LAB_001132ec;
  }
  if (local_31[0] == false) {
    Colors::setEnabled(false);
  }
  wasm::Path::setBinaryenBinDir((string *)&local_690);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|wasm-reduce\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input: ",8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)local_160,(long)input._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|test: ",7);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)WasmReduceOption.field_2._8_8_,
                       (long)test._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|working: ",10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)local_90,(long)working._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|bin dir: ",10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_690,(long)binDir._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|extra flags: ",0xe);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,extraFlags_abi_cxx11_._M_dataplus._M_p,
                       extraFlags_abi_cxx11_._M_string_length);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&options.enabledFeatures,1);
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_8b0,local_160,input._M_dataplus._M_p + (long)local_160);
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_890,WasmReduceOption.field_2._8_8_,
             test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
  wasm::copy_file(local_8b0,local_890);
  if (local_890[0] != local_880) {
    operator_delete(local_890[0],local_880[0] + 1);
  }
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0],local_8a0[0] + 1);
  }
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_870,resultOnValid.time,
             command._M_dataplus._M_p + (long)resultOnValid.time);
  ProgramResult::getFromExecution(&expected,&local_870);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|expected result:\n",0x12);
  ProgramResult::dump(&expected,(ostream *)&std::cerr);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n",0x30);
  local_180.force = &local_32;
  if (((double)CONCAT44(0x45300000,(int)(timeout >> 0x20)) - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
    local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_850,
               "execution time is dangerously close to the timeout - you should probably increase the timeout"
               ,"");
    main::anon_class_8_1_a7eb7a0b::operator()(&local_180,&local_850,&expected);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_dataplus._M_p != &local_850.field_2) {
      operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_32 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
               ,0x7c);
    std::ofstream::ofstream
              (&options.enabledFeatures,(string *)(WasmReduceOption.field_2._M_local_buf + 8),_S_bin
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&options.enabledFeatures,"waka waka\n",10);
    options.enabledFeatures.features = _VTT;
    options.disabledFeatures.features = std::ofstream::VTT_4;
    *(undefined8 *)((long)&options.enabledFeatures.features + *(long *)(_VTT + -0x18)) = _str;
    std::filebuf::~filebuf((filebuf *)&dst);
    std::ios_base::~ios_base(local_ef8);
    local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_830,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    ProgramResult::ProgramResult((ProgramResult *)auStack_1b8,&local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_dataplus._M_p != &local_830.field_2) {
      operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
    }
    bVar7 = ProgramResult::operator==((ProgramResult *)auStack_1b8,&expected);
    if (bVar7) {
      wasm::Module::Module((Module *)&options.enabledFeatures);
      writer._0_8_ = &options.field_0xb0;
      psVar16 = &writer.symbolMap._M_string_length;
      writer.options = (PassOptions *)CONCAT62(writer.options._2_6_,1);
      writer.symbolMap._M_dataplus._M_p = (pointer)0x0;
      writer.symbolMap._M_string_length._0_1_ = 0;
      psVar3 = &writer.sourceMapFilename._M_string_length;
      writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
      writer.sourceMapFilename._M_string_length._0_1_ = 0;
      psVar4 = &writer.sourceMapUrl._M_string_length;
      writer.sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
      writer.sourceMapUrl._M_string_length._0_1_ = 0;
      binDir.field_2._8_8_ = binDir.field_2._8_8_ & 0xffffffffffffff00;
      local_810[0] = local_800;
      writer._16_8_ = psVar16;
      writer.symbolMap.field_2._8_8_ = psVar3;
      writer.sourceMapFilename.field_2._8_8_ = psVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_810,WasmReduceOption.field_2._8_8_,
                 test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      wasm::ModuleWriter::write
                ((undefined1 *)((long)&binDir.field_2 + 8),&options.enabledFeatures,local_810);
      if (local_810[0] != local_800) {
        operator_delete(local_810[0],local_800[0] + 1);
      }
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7f0,resultOnValid.time,
                 command._M_dataplus._M_p + (long)resultOnValid.time);
      ProgramResult::ProgramResult((ProgramResult *)((long)&input.field_2 + 8),&local_7f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      bVar7 = ProgramResult::operator==((ProgramResult *)((long)&input.field_2 + 8),&expected);
      if (bVar7) {
        wasm::Fatal::Fatal((Fatal *)local_c00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&test.field_2 + 8),
                       "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&WasmReduceOption.field_2 + 8));
        plVar11 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
        local_68._M_dataplus._M_p = (pointer)*plVar11;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_68._M_dataplus._M_p == psVar16) {
          local_68.field_2._M_allocated_capacity = *psVar16;
          local_68.field_2._8_8_ = plVar11[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar16;
        }
        local_68._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        wasm::Fatal::operator<<((Fatal *)local_c00,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
        wasm::Fatal::~Fatal((Fatal *)local_c00);
      }
      if ((size_type *)resultOnValid._0_8_ != &resultOnValid.output._M_string_length) {
        operator_delete((void *)resultOnValid._0_8_,resultOnValid.output._M_string_length + 1);
      }
      if ((size_type *)writer.sourceMapFilename.field_2._8_8_ != psVar4) {
        operator_delete((void *)writer.sourceMapFilename.field_2._8_8_,
                        CONCAT71(writer.sourceMapUrl._M_string_length._1_7_,
                                 (undefined1)writer.sourceMapUrl._M_string_length) + 1);
      }
      if ((size_type *)writer.symbolMap.field_2._8_8_ != psVar3) {
        operator_delete((void *)writer.symbolMap.field_2._8_8_,
                        CONCAT71(writer.sourceMapFilename._M_string_length._1_7_,
                                 (undefined1)writer.sourceMapFilename._M_string_length) + 1);
      }
      if ((size_type *)writer._16_8_ != psVar16) {
        operator_delete((void *)writer._16_8_,
                        CONCAT71(writer.symbolMap._M_string_length._1_7_,
                                 (undefined1)writer.symbolMap._M_string_length) + 1);
      }
      wasm::Module::~Module((Module *)&options.enabledFeatures);
    }
    if ((size_type *)resultOnInvalid._0_8_ != &resultOnInvalid.output._M_string_length) {
      operator_delete((void *)resultOnInvalid._0_8_,resultOnInvalid.output._M_string_length + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "|checking that command has expected behavior on canonicalized (read-written) binary\n"
             ,0x54);
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"wasm-opt","");
  wasm::Path::getBinaryenBinaryTool((string *)(test.field_2._M_local_buf + 8));
  plVar11 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
  psVar16 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_68.field_2._M_allocated_capacity = *psVar16;
    local_68.field_2._8_8_ = plVar11[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar16;
    local_68._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_68._M_string_length = plVar11[1];
  *plVar11 = (long)psVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_160);
  input.field_2._8_8_ = &resultOnValid.output;
  plVar17 = plVar11 + 2;
  if ((long *)*plVar11 == plVar17) {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar17;
    resultOnValid.output._M_string_length = plVar11[3];
  }
  else {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar17;
    input.field_2._8_8_ = (long *)*plVar11;
  }
  resultOnValid._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(input.field_2._M_local_buf + 8);
  plVar17 = plVar11 + 2;
  if ((string *)*plVar11 == (string *)plVar17) {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar17;
    resultOnInvalid.output._M_string_length = plVar11[3];
    auStack_1b8 = (undefined1  [8])&resultOnInvalid.output;
  }
  else {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar17;
    auStack_1b8 = (undefined1  [8])*plVar11;
  }
  resultOnInvalid._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append(auStack_1b8,WasmReduceOption.field_2._8_8_);
  local_c00 = (undefined1  [8])&result.output;
  plVar17 = plVar11 + 2;
  if ((string *)*plVar11 == (string *)plVar17) {
    result.output._M_dataplus._M_p = (pointer)*plVar17;
    result.output._M_string_length = plVar11[3];
  }
  else {
    result.output._M_dataplus._M_p = (pointer)*plVar17;
    local_c00 = (undefined1  [8])*plVar11;
  }
  result._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(local_c00);
  plVar17 = plVar11 + 2;
  if ((long *)*plVar11 == plVar17) {
    local_fe0 = *plVar17;
    aaStack_fd8[0]._0_8_ = plVar11[3];
    options._376_8_ = &local_fe0;
  }
  else {
    local_fe0 = *plVar17;
    options._376_8_ = (long *)*plVar11;
  }
  _dst = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&options.enabledFeatures,
                               (ulong)extraFlags_abi_cxx11_._M_dataplus._M_p);
  plVar17 = plVar11 + 2;
  if ((long *)*plVar11 == plVar17) {
    writer.options = (PassOptions *)*plVar17;
    writer._16_8_ = plVar11[3];
    binDir.field_2._8_8_ = ppPVar2;
  }
  else {
    writer.options = (PassOptions *)*plVar17;
    binDir.field_2._8_8_ = (long *)*plVar11;
  }
  writer._0_8_ = plVar11[1];
  *plVar11 = (long)plVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if ((long *)options._376_8_ != &local_fe0) {
    operator_delete((void *)options._376_8_,local_fe0 + 1);
  }
  if (local_c00 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_c00,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if (auStack_1b8 != (undefined1  [8])&resultOnInvalid.output) {
    operator_delete((void *)auStack_1b8,(ulong)(resultOnInvalid.output._M_dataplus._M_p + 1));
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_a0) {
    operator_delete((void *)test.field_2._8_8_,local_a0._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)(local_1c8 + 1));
  }
  if (local_31[0] == false) {
    std::__cxx11::string::append(binDir.field_2._M_local_buf + 8);
  }
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7d0,binDir.field_2._8_8_,writer._0_8_ + binDir.field_2._8_8_);
  ProgramResult::ProgramResult((ProgramResult *)&options.enabledFeatures,&local_7d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
  }
  if (options.enabledFeatures.features == 0) {
    local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_790,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    ProgramResult::ProgramResult((ProgramResult *)local_c00,&local_790);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    bVar7 = ProgramResult::operator==((ProgramResult *)local_c00,&expected);
    if (!bVar7) {
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_770,
                 "running command on the canonicalized module should give the same results","");
      main::anon_class_8_1_a7eb7a0b::operator()(&local_180,&local_770,(ProgramResult *)local_c00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
      }
    }
    local_7b0.field_2._M_allocated_capacity = result.output._M_string_length;
    _Var18._M_p = (pointer)result._0_8_;
    if ((size_type *)result._0_8_ == &result.output._M_string_length) goto LAB_00112825;
  }
  else {
    local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7b0,"failed to read and write the binary","");
    main::anon_class_8_1_a7eb7a0b::operator()
              (&local_180,&local_7b0,(ProgramResult *)&options.enabledFeatures);
    _Var18._M_p = local_7b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._M_dataplus._M_p == &local_7b0.field_2) goto LAB_00112825;
  }
  operator_delete(_Var18._M_p,local_7b0.field_2._M_allocated_capacity + 1);
LAB_00112825:
  if (_dst != aaStack_fd8) {
    operator_delete(_dst,aaStack_fd8[0]._0_8_ + 1);
  }
  if ((PassOptions **)binDir.field_2._8_8_ != ppPVar2) {
    operator_delete((void *)binDir.field_2._8_8_,(ulong)&(writer.options)->validate);
  }
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_750,local_160,input._M_dataplus._M_p + (long)local_160);
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_730,local_90,working._M_dataplus._M_p + (long)local_90);
  wasm::copy_file(local_750,local_730);
  if (local_730[0] != local_720) {
    operator_delete(local_730[0],local_720[0] + 1);
  }
  if (local_750[0] != local_740) {
    operator_delete(local_750[0],local_740[0] + 1);
  }
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_710,local_90,working._M_dataplus._M_p + (long)local_90);
  uVar12 = wasm::file_size(local_710);
  if (local_710[0] != local_700) {
    operator_delete(local_710[0],local_700[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input size: ",0xd);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|starting reduction!\n",0x15);
  if (local_31[0] == true) {
    uVar12 = uVar12 * 2;
  }
  else {
    uVar12 = uVar12 / 10;
  }
  working.field_2._8_8_ = 0;
  uVar14 = 0;
  sVar15 = 0;
  do {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_48 = uVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,WasmReduceOption.field_2._8_8_,
               test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_90,working._M_dataplus._M_p + (long)local_90);
    Reducer::Reducer((Reducer *)&options.enabledFeatures,&local_278,&local_258,&local_298,
                     local_31[0],local_35,local_34,local_33,(ToolOptions *)local_1170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  reduce using passes...\n",0x1a);
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_90,working._M_dataplus._M_p + (long)local_90);
    lVar13 = wasm::file_size(local_238);
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] + 1);
    }
    Reducer::reduceUsingPasses((Reducer *)&options.enabledFeatures);
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,local_90,working._M_dataplus._M_p + (long)local_90);
    uVar14 = wasm::file_size((string *)local_218);
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  after pass reduction: ",0x19);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((local_48 & 1) == 0) {
      if (working.field_2._8_8_ - 1 < uVar14) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|  progress has stopped, skipping to the end\n",0x2d);
        local_40 = (char **)CONCAT71(local_40._1_7_,1);
        iVar19 = (int)uVar12;
        if (iVar19 != 1) {
          uVar12 = (ulong)(uint)((iVar19 - (iVar19 + 1 >> 0x1f)) + 1 >> 1);
          goto LAB_00112c62;
        }
      }
      else {
LAB_00112c62:
        local_40 = (char **)CONCAT71(local_40._1_7_,(char)local_48);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  pass progress: ",0x12);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", last destructive: ",0x14);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      local_c00[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c00,1);
      iVar19 = (int)uVar12;
      if (lVar13 - uVar14 < sVar15 << 2) {
        if (iVar19 < 0xb) {
          uVar8 = (iVar19 - (iVar19 + 1 >> 0x1f)) + 1 >> 1;
        }
        else {
          uVar8 = (int)((uVar12 & 0xffffffff) / 3) + 1;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|  progress is good, do not quickly decrease factor\n",
                   0x34);
        uVar8 = (iVar19 * 9) / 10;
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
      }
      if (uVar14 < 5) {
        __assert_fail("newSize > 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                      ,0x624,"int main(int, const char **)");
      }
      iVar19 = (int)uVar14;
      iVar20 = iVar19 + 3;
      if (-1 < iVar19) {
        iVar20 = iVar19;
      }
      uVar12 = (ulong)(uint)(iVar20 >> 2);
      if ((int)uVar8 <= iVar20 >> 2) {
        uVar12 = (ulong)uVar8;
      }
      while( true ) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|  reduce destructively... (factor: ",0x24);
        iVar19 = (int)uVar12;
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")\n",2);
        sVar15 = Reducer::reduceDestructively((Reducer *)&options.enabledFeatures,iVar19);
        if (sVar15 != 0) break;
        if (iVar19 == 1) {
          local_40 = (char **)CONCAT71(local_40._1_7_,1);
          break;
        }
        iVar20 = iVar19 + 3;
        if (-1 < iVar19) {
          iVar20 = iVar19;
        }
        uVar8 = iVar20 >> 2;
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
        uVar12 = (ulong)uVar8;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  destructive reduction led to size: ",0x26);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,local_90,working._M_dataplus._M_p + (long)local_90);
      wasm::file_size(local_1f8);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      local_c00[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_c00,1);
      working.field_2._8_8_ = uVar14;
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
    }
    else {
      local_40 = (char **)CONCAT71(local_40._1_7_,(char)local_48);
    }
    uVar6 = local_48;
    uVar5 = working.field_2._8_8_;
    Reducer::~Reducer((Reducer *)&options.enabledFeatures);
    uVar14 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_40._0_1_) & 0xffffffff;
    working.field_2._8_8_ = uVar5;
    if ((uVar6 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|finished, final size: ",0x17);
      local_6f0[0] = local_6e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_6f0,local_90,working._M_dataplus._M_p + (long)local_90);
      wasm::file_size(local_6f0);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if (local_6f0[0] != local_6e0) {
        operator_delete(local_6f0[0],local_6e0[0] + 1);
      }
      local_6d0[0] = local_6c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_6d0,local_90,working._M_dataplus._M_p + (long)local_90);
      local_6b0[0] = local_6a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_6b0,WasmReduceOption.field_2._8_8_,
                 test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      wasm::copy_file(local_6d0,local_6b0);
      if (local_6b0[0] != local_6a0) {
        operator_delete(local_6b0[0],local_6a0[0] + 1);
      }
      if (local_6d0[0] != local_6c0) {
        operator_delete(local_6d0[0],local_6c0[0] + 1);
      }
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1170);
      if ((size_type *)command.field_2._8_8_ != &WasmReduceOption._M_string_length) {
        operator_delete((void *)command.field_2._8_8_,WasmReduceOption._M_string_length + 1);
      }
      if ((size_type *)local_690 != &binDir._M_string_length) {
        operator_delete(local_690,binDir._M_string_length + 1);
      }
      if ((size_type *)resultOnValid.time != &command._M_string_length) {
        operator_delete((void *)resultOnValid.time,
                        CONCAT71(command._M_string_length._1_7_,(undefined1)command._M_string_length
                                ) + 1);
      }
      if (local_90 != &working._M_string_length) {
        operator_delete(local_90,CONCAT71(working._M_string_length._1_7_,
                                          (undefined1)working._M_string_length) + 1);
      }
      if ((size_type *)WasmReduceOption.field_2._8_8_ != &test._M_string_length) {
        operator_delete((void *)WasmReduceOption.field_2._8_8_,
                        CONCAT71(test._M_string_length._1_7_,(undefined1)test._M_string_length) + 1)
        ;
      }
      if (local_160 != &input._M_string_length) {
        operator_delete(local_160,
                        CONCAT71(input._M_string_length._1_7_,(undefined1)input._M_string_length) +
                        1);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options(
    "wasm-reduce",
    R"(Reduce a wasm file to a smaller one with the same behavior on a given command.

Typical usage:

  wasm-reduce orig.wasm '--command=bash a.sh' --test t.wasm --working w.wasm

The original file orig.wasm is where we begin. We then repeatedly test a small
reduction of it by writing that modification to the 'test file' (specified by
'--test'), and we run the command, in this example 'bash a.sh'. That command
should use the test file (and not the original file or any other one). Whenever
the reduction works, we write that new smaller file to the 'working file'
(specified by '--working'). The reduction 'works' if it correctly preserves the
behavior of the command on the original input, specifically, that it has the
same stdout and the result return code. Each time reduction works we continue to
reduce from that point (and each time it fails, we go back and try something
else).

As mentioned above, the command should run on the test file. That is, the first
thing that wasm-reduce does on the example above is, effectively,

  cp orig.wasm t.wasm
  bash a.sh

In other words, it copies the original to the test file, and runs the command.
Whatever the command does, we will preserve as we copy progressively smaller
files to t.wasm. As we make progress, the smallest file will be written to
the working file, w.wasm, and when reduction is done you will find the final
result there.

Comparison to creduce:

1. creduce requires the command to return 0. wasm-reduce is often used to reduce
   crashes, which have non-zero return codes, so it is natural to allow any
   return code. As mentioned above, we preserve the return code as we reduce.
2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part
   of the principle of preserving the original behavior of the command (if your
   stdout varies in uninteresting ways, your command can be a script that runs
   the real command and captures stdout to /dev/null, or filters it).
3. creduce tramples the original input file as it reduces. wasm-reduce never
   modifies the input (to avoid mistakes that cause data loss). Instead,
   when reductions work we write to the 'working file' as mentioned above, and
   the final reduction will be there.
4. creduce runs the command in a temp directory. That is safer in general, but
   it is not how the original command ran, and in particular forces additional
   work if you have multiple files (which, for wasm-reduce, is common, e.g. if
   the testcase is a combination of JavaScript and wasm). wasm-reduce runs the
   command in the current directory (of course, your command can be a script
   that changes directory to anywhere else).

More documentation can be found at

  https://github.com/WebAssembly/binaryen/wiki/Fuzzing#reducing
                      )");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add("--save-all-working",
         "-saw",
         "Save all intermediate working files, as $WORKING.0, .1, .2 etc",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           saveAllWorkingFiles = true;
           std::cout << "|saving all intermediate working files\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer(options.passOptions);
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}